

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Light_EvalRes *
embree::Lights_eval(Light_EvalRes *__return_storage_ptr__,Light *self,DifferentialGeometry *dg,
                   Vec3fa *dir)

{
  switch(self->type) {
  case LIGHT_AMBIENT:
    AmbientLight_eval(self,dg,dir);
    break;
  case LIGHT_POINT:
    PointLight_eval(__return_storage_ptr__,self,dg,dir);
    break;
  case LIGHT_DIRECTIONAL:
    DirectionalLight_eval(__return_storage_ptr__,self,dg,dir);
    break;
  case LIGHT_SPOT:
    SpotLight_eval(self,dg,dir);
    break;
  default:
    *(undefined8 *)&(__return_storage_ptr__->value).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_0 + 8) = 0;
    __return_storage_ptr__->dist = INFINITY;
    __return_storage_ptr__->pdf = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

Light_EvalRes Lights_eval(const Light* self,
                          const DifferentialGeometry& dg,
                          const Vec3fa& dir)
{
  TutorialLightType ty = self->type;
  switch (ty) {
  case LIGHT_AMBIENT     : return AmbientLight_eval(self,dg,dir);
  case LIGHT_POINT       : return PointLight_eval(self,dg,dir);
  case LIGHT_DIRECTIONAL : return DirectionalLight_eval(self,dg,dir);
  case LIGHT_SPOT        : return SpotLight_eval(self,dg,dir);
  case LIGHT_QUAD        : return QuadLight_eval(self,dg,dir);
  default: {
    Light_EvalRes res;
    res.value = Vec3fa(0,0,0);
    res.dist = inf;
    res.pdf = 0.f;
    return res;
  }
  }
}